

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::RequestBuilder::Build(RequestBuilder *this)

{
  RequestType rq;
  bool bVar1;
  pointer pRVar2;
  string *data;
  pointer pOVar3;
  headers_t *ppcVar4;
  LogManager *this_00;
  ostringstream *poVar5;
  ostream *poVar6;
  function<void_(const_restincurl::Result_&)> local_1e8;
  byte local_1b1;
  Log local_1b0;
  CURLoption local_30 [4];
  long local_20;
  CURLoption local_14;
  RequestBuilder *local_10;
  RequestBuilder *this_local;
  
  if ((this->is_built_ & 1U) == 0) {
    local_10 = this;
    if ((this->have_data_in_ & 1U) == 0) {
      pRVar2 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
               operator->(&this->request_);
      data = Request::getDefaultInBuffer_abi_cxx11_(pRVar2);
      StoreData<std::__cxx11::string>(this,data);
    }
    if ((this->have_data_out_ & 1U) != 0) {
      pOVar3 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
               operator->(&this->options_);
      local_14 = CURLOPT_UPLOAD;
      local_20 = 1;
      Options::Set<long>(pOVar3,&local_14,&local_20);
    }
    if (-1 < this->request_timeout_) {
      pOVar3 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
               operator->(&this->options_);
      local_30[3] = 0x9b;
      Options::Set<long>(pOVar3,local_30 + 3,&this->request_timeout_);
    }
    if (-1 < this->connect_timeout_) {
      pOVar3 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
               operator->(&this->options_);
      local_30[2] = 0x9c;
      Options::Set<long>(pOVar3,local_30 + 2,&this->connect_timeout_);
    }
    pRVar2 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
             operator->(&this->request_);
    ppcVar4 = Request::GetHeaders(pRVar2);
    if (*ppcVar4 != (headers_t)0x0) {
      pOVar3 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
               operator->(&this->options_);
      local_30[1] = 0x2727;
      pRVar2 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
               operator->(&this->request_);
      ppcVar4 = Request::GetHeaders(pRVar2);
      Options::Set<curl_slist*>(pOVar3,local_30 + 1,ppcVar4);
    }
    pOVar3 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
             operator->(&this->options_);
    local_30[0] = CURLOPT_URL;
    Options::Set(pOVar3,local_30,&this->url_);
    this_00 = logfault::LogManager::Instance();
    bVar1 = logfault::LogManager::IsRelevant(this_00,DEBUGGING);
    local_1b1 = 0;
    if (bVar1) {
      logfault::Log::Log(&local_1b0,DEBUGGING);
      local_1b1 = 1;
      poVar5 = logfault::Log::Line_abi_cxx11_(&local_1b0);
      poVar6 = std::operator<<((ostream *)poVar5,"restincurl: ");
      poVar6 = std::operator<<(poVar6,"Preparing connect to: ");
      poVar6 = std::operator<<(poVar6,(string *)&this->url_);
      std::ios::operator_cast_to_bool((ios *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18)));
    }
    if ((local_1b1 & 1) != 0) {
      logfault::Log::~Log(&local_1b0);
    }
    pRVar2 = std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>::
             operator->(&this->request_);
    rq = this->request_type_;
    std::function<void_(const_restincurl::Result_&)>::function(&local_1e8,&this->completion_);
    Request::Prepare(pRVar2,rq,&local_1e8);
    std::function<void_(const_restincurl::Result_&)>::~function(&local_1e8);
    this->is_built_ = true;
  }
  return;
}

Assistant:

void Build() {
            if (!is_built_) {
                // Set up Data Handlers
                if (!have_data_in_) {
                    // Use a default std::string. We expect json anyway...
                    this->StoreData(request_->getDefaultInBuffer());
                }

                if (have_data_out_) {
                    options_->Set(CURLOPT_UPLOAD, 1L);
                }

                if (request_timeout_ >= 0) {
                    options_->Set(CURLOPT_TIMEOUT_MS, request_timeout_);
                }

                if (connect_timeout_ >= 0) {
                    options_->Set(CURLOPT_CONNECTTIMEOUT_MS, connect_timeout_);
                }

                // Set headers
                if (request_->GetHeaders()) {
                    options_->Set(CURLOPT_HTTPHEADER, request_->GetHeaders());
                }

                // TODO: Prepare the final url (we want nice, correctly encoded request arguments)
                options_->Set(CURLOPT_URL, url_);
                RESTINCURL_LOG("Preparing connect to: " << url_);

                // Prepare request
                request_->Prepare(request_type_, std::move(completion_));
                is_built_ = true;
            }
        }